

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

int Sfm_MffcDeref_rec(Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  dVar5 = Mio_GateReadArea((Mio_Gate_t *)(pObj->field_5).pData);
  iVar3 = (int)((float)dVar5 * 1000.0);
  if (0 < (pObj->vFanins).nSize) {
    lVar4 = 0;
    do {
      pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]];
      iVar1 = (pObj_00->vFanouts).nSize;
      if (iVar1 < 1) {
        __assert_fail("pFanin->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x2b7,"int Sfm_MffcDeref_rec(Abc_Obj_t *)");
      }
      iVar1 = iVar1 + -1;
      (pObj_00->vFanouts).nSize = iVar1;
      if (((iVar1 == 0) && (uVar2 = *(uint *)&pObj_00->field_0x14 & 0xf, uVar2 != 2)) &&
         (uVar2 != 5)) {
        iVar1 = Sfm_MffcDeref_rec(pObj_00);
        iVar3 = iVar3 + iVar1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pObj->vFanins).nSize);
  }
  return iVar3;
}

Assistant:

int Sfm_MffcDeref_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Area = Scl_Flt2Int(Mio_GateReadArea((Mio_Gate_t *)pObj->pData));
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        assert( pFanin->vFanouts.nSize > 0 );
        if ( --pFanin->vFanouts.nSize == 0 && !Abc_ObjIsCi(pFanin) )
            Area += Sfm_MffcDeref_rec( pFanin );
    }
    return Area;
}